

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

void __thiscall mkvmuxer::AudioTrack::~AudioTrack(AudioTrack *this)

{
  char *pcVar1;
  uint8_t *puVar2;
  ContentEncoding *pCVar3;
  ContentEncoding **ppCVar4;
  ulong uVar5;
  
  (this->super_Track)._vptr_Track = (_func_int **)&PTR__AudioTrack_0013e9b8;
  pcVar1 = (this->super_Track).codec_id_;
  if (pcVar1 != (char *)0x0) {
    operator_delete__(pcVar1);
  }
  puVar2 = (this->super_Track).codec_private_;
  if (puVar2 != (uint8_t *)0x0) {
    operator_delete__(puVar2);
  }
  pcVar1 = (this->super_Track).language_;
  if (pcVar1 != (char *)0x0) {
    operator_delete__(pcVar1);
  }
  pcVar1 = (this->super_Track).name_;
  if (pcVar1 != (char *)0x0) {
    operator_delete__(pcVar1);
  }
  ppCVar4 = (this->super_Track).content_encoding_entries_;
  if (ppCVar4 == (ContentEncoding **)0x0) {
    return;
  }
  if ((this->super_Track).content_encoding_entries_size_ != 0) {
    uVar5 = 0;
    do {
      pCVar3 = (this->super_Track).content_encoding_entries_[uVar5];
      if ((pCVar3 != (ContentEncoding *)0x0) && (pCVar3->enc_key_id_ != (uint8_t *)0x0)) {
        operator_delete__(pCVar3->enc_key_id_);
      }
      operator_delete(pCVar3);
      uVar5 = uVar5 + 1;
    } while (uVar5 < (this->super_Track).content_encoding_entries_size_);
    ppCVar4 = (this->super_Track).content_encoding_entries_;
    if (ppCVar4 == (ContentEncoding **)0x0) {
      return;
    }
  }
  operator_delete__(ppCVar4);
  return;
}

Assistant:

Track::~Track() {
  delete[] codec_id_;
  delete[] codec_private_;
  delete[] language_;
  delete[] name_;

  if (content_encoding_entries_) {
    for (uint32_t i = 0; i < content_encoding_entries_size_; ++i) {
      ContentEncoding* const encoding = content_encoding_entries_[i];
      delete encoding;
    }
    delete[] content_encoding_entries_;
  }
}